

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strscpy.c
# Opt level: O2

int run_test_strscpy(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  char d [4];
  
  eval_a = uv__strscpy(d,"",0);
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = uv__strscpy(d,"x",0);
    eval_b = 0;
    if (eval_a == 0) {
      d[0] = '\0';
      d[1] = '\0';
      d[2] = '\0';
      d[3] = '\0';
      eval_a = 1;
      eval_b = uv__strscpy(d,"x",4);
      if (eval_b == 1) {
        iVar1 = memcmp(d,"x",4);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          d[0] = '\0';
          d[1] = '\0';
          d[2] = '\0';
          d[3] = '\0';
          eval_a = 2;
          eval_b = uv__strscpy(d,"xy",4);
          if (eval_b == 2) {
            iVar1 = memcmp(d,"xy",4);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = 3;
              eval_b = uv__strscpy(d,"xyz",4);
              if (eval_b == 3) {
                iVar1 = memcmp(d,"xyz",4);
                eval_a = (int64_t)iVar1;
                eval_b = 0;
                if (eval_a == 0) {
                  eval_a = -7;
                  eval_b = uv__strscpy(d,"xyzz",4);
                  if (eval_b == -7) {
                    iVar1 = memcmp(d,"xyz",4);
                    eval_a = (int64_t)iVar1;
                    eval_b = 0;
                    if (eval_a == 0) {
                      eval_a = -7;
                      eval_b = uv__strscpy(d,"xyzzy",4);
                      if (eval_b == -7) {
                        iVar1 = memcmp(d,"xyz",4);
                        eval_a = (int64_t)iVar1;
                        eval_b = 0;
                        if (eval_a == 0) {
                          return 0;
                        }
                        pcVar3 = "0";
                        pcVar2 = "memcmp(d, \"xyz\", sizeof(d))";
                        uVar4 = 0x32;
                      }
                      else {
                        pcVar3 = "uv__strscpy(d, \"xyzzy\", sizeof(d))";
                        pcVar2 = "UV_E2BIG";
                        uVar4 = 0x31;
                      }
                    }
                    else {
                      pcVar3 = "0";
                      pcVar2 = "memcmp(d, \"xyz\", sizeof(d))";
                      uVar4 = 0x2f;
                    }
                  }
                  else {
                    pcVar3 = "uv__strscpy(d, \"xyzz\", sizeof(d))";
                    pcVar2 = "UV_E2BIG";
                    uVar4 = 0x2e;
                  }
                }
                else {
                  pcVar3 = "0";
                  pcVar2 = "memcmp(d, \"xyz\", sizeof(d))";
                  uVar4 = 0x2c;
                }
              }
              else {
                pcVar3 = "uv__strscpy(d, \"xyz\", sizeof(d))";
                pcVar2 = "3";
                uVar4 = 0x2b;
              }
            }
            else {
              pcVar3 = "0";
              pcVar2 = "memcmp(d, \"xy\\0\", sizeof(d))";
              uVar4 = 0x29;
            }
          }
          else {
            pcVar3 = "uv__strscpy(d, \"xy\", sizeof(d))";
            pcVar2 = "2";
            uVar4 = 0x28;
          }
        }
        else {
          pcVar3 = "0";
          pcVar2 = "memcmp(d, \"x\\0\\0\", sizeof(d))";
          uVar4 = 0x25;
        }
      }
      else {
        pcVar3 = "uv__strscpy(d, \"x\", sizeof(d))";
        pcVar2 = "1";
        uVar4 = 0x24;
      }
    }
    else {
      pcVar3 = "0";
      pcVar2 = "uv__strscpy(d, \"x\", 0)";
      uVar4 = 0x21;
    }
  }
  else {
    pcVar3 = "0";
    pcVar2 = "uv__strscpy(d, \"\", 0)";
    uVar4 = 0x20;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(strscpy) {
  char d[4];

  ASSERT_OK(uv__strscpy(d, "", 0));
  ASSERT_OK(uv__strscpy(d, "x", 0));

  memset(d, 0, sizeof(d));
  ASSERT_EQ(1, uv__strscpy(d, "x", sizeof(d)));
  ASSERT_OK(memcmp(d, "x\0\0", sizeof(d)));

  memset(d, 0, sizeof(d));
  ASSERT_EQ(2, uv__strscpy(d, "xy", sizeof(d)));
  ASSERT_OK(memcmp(d, "xy\0", sizeof(d)));

  ASSERT_EQ(3, uv__strscpy(d, "xyz", sizeof(d)));
  ASSERT_OK(memcmp(d, "xyz", sizeof(d)));

  ASSERT_EQ(UV_E2BIG, uv__strscpy(d, "xyzz", sizeof(d)));
  ASSERT_OK(memcmp(d, "xyz", sizeof(d)));

  ASSERT_EQ(UV_E2BIG, uv__strscpy(d, "xyzzy", sizeof(d)));
  ASSERT_OK(memcmp(d, "xyz", sizeof(d)));

  return 0;
}